

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cascade.h
# Opt level: O2

void __thiscall
Iir::CascadeStages<3,_Iir::DirectFormII>::setup
          (CascadeStages<3,_Iir::DirectFormII> *this,double (*sosCoefficients) [3] [6])

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x90; lVar1 = lVar1 + 0x30) {
    Biquad::setCoefficients
              ((Biquad *)((long)&this->m_stages[0].m_a0 + lVar1),
               *(double *)((long)(*sosCoefficients)[0] + lVar1 + 0x18),
               *(double *)((long)(*sosCoefficients)[0] + lVar1 + 0x20),
               *(double *)((long)(*sosCoefficients)[0] + lVar1 + 0x28),
               *(double *)((long)(*sosCoefficients)[0] + lVar1),
               *(double *)((long)(*sosCoefficients)[0] + lVar1 + 8),
               *(double *)((long)(*sosCoefficients)[0] + lVar1 + 0x10));
  }
  return;
}

Assistant:

void setup (const double (&sosCoefficients)[MaxStages][6]) {
                for (int i = 0; i < MaxStages; i++) {
                        m_stages[i].setCoefficients(
                                sosCoefficients[i][3],
                                sosCoefficients[i][4],
                                sosCoefficients[i][5],
                                sosCoefficients[i][0],
                                sosCoefficients[i][1],
                                sosCoefficients[i][2]);
                }
        }